

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_images_core.cxx
# Opt level: O3

Fl_Image * fl_check_images(char *name,uchar *header,int param_3)

{
  Fl_Image *this;
  
  if ((*(short *)(header + 4) == 0x6137 && *(int *)header == 0x38464947) ||
     (*(short *)(header + 4) == 0x6139 && *(int *)header == 0x38464947)) {
    this = (Fl_Image *)operator_new(0x38);
    Fl_GIF_Image::Fl_GIF_Image((Fl_GIF_Image *)this,name);
  }
  else if (*(short *)header == 0x4d42) {
    this = (Fl_Image *)operator_new(0x40);
    Fl_BMP_Image::Fl_BMP_Image((Fl_BMP_Image *)this,name);
  }
  else if ((*header == 'P') && ((byte)(header[1] - 0x31) < 7)) {
    this = (Fl_Image *)operator_new(0x40);
    Fl_PNM_Image::Fl_PNM_Image((Fl_PNM_Image *)this,name);
  }
  else if (*(int *)header == 0x474e5089) {
    this = (Fl_Image *)operator_new(0x40);
    Fl_PNG_Image::Fl_PNG_Image((Fl_PNG_Image *)this,name);
  }
  else if ((header[2] == 0xff && *(short *)header == -0x2701) && ((byte)(header[3] + 0x40) < 0x30))
  {
    this = (Fl_Image *)operator_new(0x40);
    Fl_JPEG_Image::Fl_JPEG_Image((Fl_JPEG_Image *)this,name);
  }
  else {
    this = (Fl_Image *)0x0;
  }
  return this;
}

Assistant:

Fl_Image *					// O - Image, if found
fl_check_images(const char *name,		// I - Filename
                uchar      *header,		// I - Header data from file
		int) {				// I - Amount of data (not used)
  if (memcmp(header, "GIF87a", 6) == 0 ||
      memcmp(header, "GIF89a", 6) == 0)	// GIF file
    return new Fl_GIF_Image(name);

  if (memcmp(header, "BM", 2) == 0)	// BMP file
    return new Fl_BMP_Image(name);

  if (header[0] == 'P' && header[1] >= '1' && header[1] <= '7')
					// Portable anymap
    return new Fl_PNM_Image(name);

#ifdef HAVE_LIBPNG
  if (memcmp(header, "\211PNG", 4) == 0)// PNG file
    return new Fl_PNG_Image(name);
#endif // HAVE_LIBPNG

#ifdef HAVE_LIBJPEG
  if (memcmp(header, "\377\330\377", 3) == 0 &&
					// Start-of-Image
      header[3] >= 0xc0 && header[3] <= 0xef)
	   				// APPn for JPEG file
    return new Fl_JPEG_Image(name);
#endif // HAVE_LIBJPEG

  return 0;
}